

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getFIRST(void)

{
  int iVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *this;
  iterator iVar6;
  mapped_type *pmVar7;
  pointer pbVar8;
  bool bVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  bool bVar13;
  char nonTerminalChar;
  char ch;
  char temp;
  string rightSide;
  undefined1 local_87;
  char local_86;
  undefined1 local_85;
  uint local_84;
  size_t local_80;
  _Base_ptr local_78;
  pointer local_70;
  pointer local_68;
  char *local_60;
  char *local_58;
  string local_50;
  undefined7 uStack_4f;
  long local_48;
  
  do {
    uVar10 = 0;
    p_Var5 = nonTerminalSymbol._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var5 != &nonTerminalSymbol._M_t._M_impl.super__Rb_tree_header) {
      local_87 = (undefined1)p_Var5[1]._M_color;
      local_84 = uVar10;
      local_78 = p_Var5;
      pmVar2 = std::
               map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&FIRST,&local_87);
      local_80 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      pmVar3 = std::
               map<char,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&GRAMMAR_abi_cxx11_,&local_87);
      local_70 = (pmVar3->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      pbVar8 = (pmVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      while (pbVar8 != local_70) {
        local_68 = pbVar8;
        std::__cxx11::string::string(&local_50,(string *)pbVar8);
        pcVar12 = (char *)CONCAT71(uStack_4f,local_50);
        local_60 = pcVar12 + local_48;
        do {
          if (pcVar12 == local_60) break;
          local_86 = *pcVar12;
          iVar1 = isupper((int)local_86);
          if (iVar1 == 0) {
            p_Var4 = (_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)std::
                        map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&FIRST,&local_87);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_unique<char_const&>(p_Var4,&local_86);
            break;
          }
          pmVar2 = std::
                   map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&FIRST,&local_86);
          bVar9 = false;
          local_58 = pcVar12;
          for (p_Var5 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var5 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
            local_85 = (undefined1)p_Var5[1]._M_color;
            bVar13 = local_85 == 0x40;
            p_Var4 = (_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)std::
                        map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&FIRST,&local_87);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_unique<char_const&>(p_Var4,&local_85);
            bVar9 = (bool)(bVar9 | bVar13);
          }
          pcVar12 = local_58 + 1;
        } while (bVar9);
        std::__cxx11::string::~string(&local_50);
        pbVar8 = local_68 + 1;
      }
      sVar11 = (size_t)(int)local_80;
      pmVar2 = std::
               map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&FIRST,&local_87);
      uVar10 = CONCAT31((int3)(local_84 >> 8),
                        (byte)local_84 |
                        sVar11 != (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_78);
    }
    if ((uVar10 & 1) == 0) {
      for (p_Var5 = nonTerminalSymbol._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &nonTerminalSymbol._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        local_50 = *(string *)&p_Var5[1]._M_color;
        this = &std::
                map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&FIRST,(key_type *)&local_50)->_M_t;
        local_87 = 0x40;
        iVar6 = std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                find(this,&local_87);
        pmVar2 = std::
                 map<char,_std::set<char,_std::less<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::set<char,_std::less<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&FIRST,(key_type *)&local_50);
        pmVar7 = std::
                 map<char,_bool,_std::less<char>,_std::allocator<std::pair<const_char,_bool>_>_>::
                 operator[](&toEpsilon,(key_type *)&local_50);
        *pmVar7 = (_Rb_tree_header *)iVar6._M_node != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
      }
      return;
    }
  } while( true );
}

Assistant:

void getFIRST() {   //计算 FIRST 集合
    bool update = true;
    while (update) {
        update = false;
        for (char nonTerminalChar : nonTerminalSymbol) { //遍历非终结符
            int firstSize = FIRST[nonTerminalChar].size();
            for (string rightSide : GRAMMAR[nonTerminalChar]) {  //遍历产生式右部
                for (char ch : rightSide) {     //遍历产生式右部所有字符
                    if (!isupper(ch)) {     //如果是终结符
                        FIRST[nonTerminalChar].insert(ch);  //将该终结符加入到 nonTerminalChar 的 First 集合中
                        break;      //退出循环
                    } else {
                        bool flag = false;      //判断 First 集合是否存在空串
                        for (char temp : FIRST[ch]) {   //将 ch 的 First 集合加入到 nonTerminalChar 的 First 集合中
                            if (temp == '@') {
                                flag = true;
                            }
                            FIRST[nonTerminalChar].insert(temp);
                        }
                        if (!flag) {        //如果不存在空串，退出循环
                            break;
                        }
                    }
                }
            }
            if (firstSize != FIRST[nonTerminalChar].size()) {
                update = true;
            }
        }
    }
    for (char nonTerminalChar: nonTerminalSymbol) {
        toEpsilon[nonTerminalChar] = FIRST[nonTerminalChar].find('@') != FIRST[nonTerminalChar].end();
    }
}